

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O3

void __thiscall llvm::yaml::Input::~Input(Input *this)

{
  ~Input(this);
  operator_delete(this,0x118);
  return;
}

Assistant:

Input::~Input() = default;